

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O2

void use_handle(handle h)

{
  ostream *poVar1;
  int a;
  
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,*(int *)h.super_strong_typedef<handle,_int_*>.value_);
  std::operator<<(poVar1,'\n');
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void use_handle(handle h)
{
    // we can dereference it
    std::cout << *h << '\n';

    // and compare it
    (void)(h == handle(nullptr));

    // and reassign
    int a;
    h = handle(&a);
    // or get back
    int* ptr = static_cast<int*>(h);
    std::cout << &a << ' ' << ptr << '\n';
}